

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmMull<(moira::Instr)156,(moira::Mode)10,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  Syntax SVar2;
  bool bVar3;
  u32 ext_00;
  StrWriter *pSVar4;
  char *local_80;
  Av<(moira::Instr)156,_(moira::Mode)10,_4> local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_58;
  char *local_50;
  char *fill;
  Dn dh;
  Dn dl;
  Ea<(moira::Mode)10,_4> src;
  u32 ext;
  u32 old;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  uVar1 = *addr;
  ext_00 = dasmIncRead<2>(this,addr);
  Op<(moira::Mode)10,4>((Ea<(moira::Mode)10,_4> *)&dh,this,op & 7,addr);
  Dn::Dn((Dn *)((long)&fill + 4),ext_00 >> 0xc & 7);
  Dn::Dn((Dn *)&fill,ext_00 & 7);
  if ((str->style->syntax == GNU) || (str->style->syntax == GNU_MIT)) {
    local_80 = ",";
  }
  else {
    local_80 = ":";
  }
  local_50 = local_80;
  SVar2 = str->style->syntax;
  if ((SVar2 != GNU && SVar2 != GNU_MIT) || (bVar3 = isValidExt(this,MULL,IXPC,op,ext_00), bVar3)) {
    if ((ext_00 & 0x800) == 0) {
      StrWriter::operator<<(str);
    }
    else {
      StrWriter::operator<<(str);
    }
    pSVar4 = StrWriter::operator<<(str);
    local_58 = (str->tab).raw;
    pSVar4 = StrWriter::operator<<(pSVar4,(Tab)local_58);
    pSVar4 = StrWriter::operator<<(pSVar4,(Ea<(moira::Mode)10,_4> *)&dh);
    StrWriter::operator<<(pSVar4);
    if ((ext_00 & 0x400) == 0) {
      local_68 = fill._4_4_;
      StrWriter::operator<<(str,fill._4_4_);
    }
    else {
      local_60 = fill._0_4_;
      pSVar4 = StrWriter::operator<<(str,fill._0_4_);
      pSVar4 = StrWriter::operator<<(pSVar4,local_50);
      local_64 = fill._4_4_;
      StrWriter::operator<<(pSVar4,fill._4_4_);
    }
    local_6c.ext1 = 0;
    StrWriter::operator<<(str,&local_6c);
  }
  else {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)156,(moira::Mode)10,4>(this,str,addr,op);
  }
  return;
}

Assistant:

void
Moira::dasmMull(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead <Word> (addr);
    auto src = Op <M,S> ( _____________xxx(op), addr );
    auto dl  = Dn       ( _xxx____________(ext)      );
    auto dh  = Dn       ( _____________xxx(ext)      );

    auto fill = str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT ? "," : ":";

    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            // Catch illegal extension words
            if (!isValidExt(I, M, op, ext)) {

                addr = old;
                dasmIllegal<I, M, S>(str, addr, op);
                return;
            }
            [[fallthrough]];

        default:

            (ext & 1 << 11) ? str << Ins<Instr::MULS>{} : str << Ins<Instr::MULU>{};
            str << Sz<S>{} << str.tab << src << Sep{};
            (ext & 1 << 10) ? str << dh << fill << dl : str << dl;
            str << Av<I, M, S>{};
    }
}